

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void text_search_list(t_text_search *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  uint uVar2;
  t_key_conflict *ptVar3;
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  t_atomtype tVar11;
  _binbuf *x_00;
  t_atom *ptVar12;
  t_atom *ptVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  word *pwVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  float fVar26;
  float fVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int local_a4;
  ulong local_a0;
  int local_60;
  
  x_00 = text_client_getbuf(&x->x_tc);
  if (x_00 == (_binbuf *)0x0) {
    return;
  }
  uVar2 = x->x_nkeys;
  if (argc < (int)uVar2) {
    pd_error(x,"need %d keys, only got %d in list",(ulong)uVar2,(ulong)(uint)argc);
  }
  ptVar12 = binbuf_getvec(x_00);
  uVar9 = binbuf_getnatom(x_00);
  if ((int)uVar2 < 1) {
    bug("text_search");
  }
  if (argc < 1) {
    argc = 0;
  }
  uVar23 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar23 = 0;
  }
  uVar25 = 0;
  uVar20 = 0;
  bVar6 = false;
  local_a0 = 0xffffffffffffffff;
  local_a4 = -1;
  iVar15 = 0;
  while( true ) {
    ptVar13 = ptVar12 + uVar25;
    while( true ) {
      uVar25 = uVar25 + 1;
      if (uVar25 - uVar23 == 1) goto LAB_00185cd9;
      if (((ptVar13->a_type & ~A_FLOAT) == A_SEMI) || (uVar25 - (uVar9 - 1) == 1)) break;
      ptVar13 = ptVar13 + 1;
    }
    iVar7 = local_a4;
    uVar8 = local_a0;
    if (x->x_onset <= iVar15) break;
LAB_00185cb2:
    local_a0 = uVar8;
    local_a4 = iVar7;
    iVar15 = iVar15 + 1;
    uVar20 = uVar25 & 0xffffffff;
  }
  if (iVar15 < x->x_onset + x->x_range) {
    iVar10 = (int)uVar20;
    local_60 = ((int)uVar25 - iVar10) + -1;
    ptVar3 = x->x_keyvec;
    iVar24 = ptVar3->k_field;
    iVar14 = ptVar3->k_binop;
    lVar16 = 0;
    iVar18 = iVar14;
    iVar21 = iVar24;
    do {
      pwVar19 = &argv[lVar16].a_w;
      lVar22 = 0;
      while( true ) {
        if ((ulong)(uint)argc - lVar16 == lVar22) {
          iVar7 = iVar15;
          uVar8 = uVar20;
          if (local_a4 < 0) goto LAB_00185cb2;
          lVar16 = 0;
          goto LAB_00185af4;
        }
        iVar5 = (int)lVar22;
        if (local_60 <= iVar21 + iVar5) goto LAB_00185cb2;
        iVar17 = iVar10 + iVar21 + iVar5;
        if (ptVar12[iVar17].a_type != ((t_atom *)(pwVar19 + -1))->a_type) goto LAB_00185cb2;
        if ((float)ptVar12[iVar17].a_type == 1.4013e-45) {
          switch(iVar18) {
          case 0:
            if ((ptVar12[iVar17].a_w.w_float != pwVar19->w_float) ||
               (NAN(ptVar12[iVar17].a_w.w_float) || NAN(pwVar19->w_float))) goto LAB_00185cb2;
            break;
          case 1:
            if (ptVar12[iVar17].a_w.w_float <= pwVar19->w_float) goto LAB_00185cb2;
            break;
          case 2:
            if (ptVar12[iVar17].a_w.w_float <= pwVar19->w_float &&
                pwVar19->w_float != ptVar12[iVar17].a_w.w_float) goto LAB_00185cb2;
            break;
          case 3:
            if (pwVar19->w_float <= ptVar12[iVar17].a_w.w_float) goto LAB_00185cb2;
            break;
          case 4:
            if (pwVar19->w_float <= ptVar12[iVar17].a_w.w_float &&
                ptVar12[iVar17].a_w.w_float != pwVar19->w_float) goto LAB_00185cb2;
          }
        }
        else {
          if (iVar18 != 0) {
            if (!bVar6) {
              pd_error(x,"text search (%s): only exact matches allowed for symbols",
                       pwVar19->w_symbol->s_name);
            }
            bVar6 = true;
            goto LAB_00185cb2;
          }
          if (ptVar12[iVar17].a_w.w_symbol != pwVar19->w_symbol) goto LAB_00185cb2;
        }
        if ((int)lVar16 + iVar5 + 1 < (int)uVar2) break;
        lVar22 = lVar22 + 1;
        pwVar19 = pwVar19 + 2;
      }
      iVar21 = ptVar3[lVar16 + lVar22 + 1].k_field;
      iVar18 = ptVar3[lVar16 + lVar22 + 1].k_binop;
      lVar16 = lVar16 + lVar22 + 1;
    } while( true );
  }
LAB_00185cd9:
  outlet_float(x->x_out1,(float)local_a4);
  return;
LAB_00185af4:
  ptVar13 = argv + lVar16;
  lVar22 = 0;
  do {
    iVar7 = local_a4;
    uVar8 = local_a0;
    if ((ulong)(uint)argc - lVar16 == lVar22) goto LAB_00185cb2;
    iVar21 = (int)lVar22;
    if ((local_60 <= iVar24 + iVar21) ||
       (tVar11 = ptVar12[iVar10 + iVar24 + iVar21].a_type, tVar11 != ptVar13->a_type)) {
      bug("text search 2");
      tVar11 = ptVar13->a_type;
    }
    if (tVar11 == A_FLOAT) {
      auVar28._0_12_ = ZEXT812(0xe0ad78ec);
      auVar28._12_4_ = 0;
      if (-1 < (int)local_a0) {
        auVar28 = ZEXT416((uint)ptVar12[(int)local_a0 + iVar24 + iVar21].a_w.w_index);
      }
      fVar29 = ptVar12[iVar10 + iVar24 + iVar21].a_w.w_float;
      fVar26 = auVar28._0_4_;
      if (iVar14 - 1U < 2) {
LAB_00185c0a:
        iVar7 = iVar15;
        uVar8 = uVar20;
        if ((fVar29 < fVar26) || (iVar7 = local_a4, uVar8 = local_a0, fVar26 < fVar29))
        goto LAB_00185cb2;
      }
      else {
        if (1 < iVar14 - 3U) {
          if (iVar14 != 5) goto LAB_00185c1c;
          fVar1 = (ptVar13->a_w).w_float;
          if ((fVar1 <= fVar29) && (fVar1 <= fVar26)) goto LAB_00185c0a;
          if ((fVar1 < fVar29) || (fVar1 < fVar26)) {
            auVar27._0_8_ = CONCAT44(fVar26 - fVar1,fVar29 - fVar1) ^ 0x8000000080000000;
            auVar27._8_4_ = -(0.0 - fVar1);
            auVar27._12_4_ = -(0.0 - fVar1);
            auVar4._4_4_ = fVar26 - fVar1;
            auVar4._0_4_ = fVar29 - fVar1;
            auVar4._8_4_ = 0.0 - fVar1;
            auVar4._12_4_ = 0.0 - fVar1;
            auVar28 = maxps(auVar27,auVar4);
            fVar29 = auVar28._4_4_;
          }
        }
        iVar7 = iVar15;
        uVar8 = uVar20;
        if ((auVar28._0_4_ < fVar29) || (iVar7 = local_a4, uVar8 = local_a0, fVar29 < auVar28._0_4_)
           ) goto LAB_00185cb2;
      }
    }
LAB_00185c1c:
    if ((int)lVar16 + iVar21 + 1 < (int)uVar2) break;
    ptVar13 = ptVar13 + 1;
    lVar22 = lVar22 + 1;
  } while( true );
  iVar24 = x->x_keyvec[lVar16 + lVar22 + 1].k_field;
  iVar14 = x->x_keyvec[lVar16 + lVar22 + 1].k_binop;
  lVar16 = lVar16 + lVar22 + 1;
  goto LAB_00185af4;
}

Assistant:

static void text_search_list(t_text_search *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int i, n, lineno, bestline = -1, beststart=-1, bestn, thisstart,
        nkeys = x->x_nkeys, failed = 0;
    t_atom *vec;
    if (!b)
       return;
    if (argc < nkeys)
    {
        pd_error(x, "need %d keys, only got %d in list",
            nkeys, argc);
    }
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (nkeys < 1)
        bug("text_search");
    for (i = lineno = thisstart = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA || i == n-1)
        {
            int thisn, j, field, binop;
            if (lineno < x->x_onset)
                goto nomatch;
            if (lineno >= x->x_onset + x->x_range)
                break;
            thisn = i - thisstart;
            field = x->x_keyvec[0].k_field;
            binop = x->x_keyvec[0].k_binop;
                /* do we match? */
            for (j = 0; j < argc; )
            {
                if (field >= thisn ||
                    vec[thisstart+field].a_type != argv[j].a_type)
                        goto nomatch;
                if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                {
                    switch (binop)
                    {
                        case KB_EQ:
                            if (vec[thisstart+field].a_w.w_float !=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GT:
                            if (vec[thisstart+field].a_w.w_float <=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GE:
                            if (vec[thisstart+field].a_w.w_float <
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LT:
                            if (vec[thisstart+field].a_w.w_float >=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LE:
                            if (vec[thisstart+field].a_w.w_float >
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                            /* the other possibility ('near') never fails */
                    }
                }
                else                                /* arg is a symbol */
                {
                    if (binop != KB_EQ)
                    {
                        if (!failed)
                        {
                            pd_error(x,
                    "text search (%s): only exact matches allowed for symbols",
                                argv[j].a_w.w_symbol->s_name);
                            failed = 1;
                        }
                        goto nomatch;
                    }
                    if (vec[thisstart+field].a_w.w_symbol !=
                        argv[j].a_w.w_symbol)
                            goto nomatch;
                }
                if (++j >= nkeys)    /* if at last key just increment field */
                    field++;
                else field = x->x_keyvec[j].k_field,    /* else next key */
                        binop = x->x_keyvec[j].k_binop;
            }
                /* the line matches.  Now, if there is a previous match, are
                we better than it? */
            if (bestline >= 0)
            {
                field = x->x_keyvec[0].k_field;
                binop = x->x_keyvec[0].k_binop;
                for (j = 0; j < argc; )
                {
                    if (field >= thisn
                        || vec[thisstart+field].a_type != argv[j].a_type)
                            bug("text search 2");
                    if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                    {
                        float thisv = vec[thisstart+field].a_w.w_float,
                            bestv = (beststart >= 0 ?
                                vec[beststart+field].a_w.w_float : -1e20);
                        switch (binop)
                        {
                            case KB_GT:
                            case KB_GE:
                                if (thisv < bestv)
                                    goto replace;
                                else if (thisv > bestv)
                                    goto nomatch;
                            break;
                            case KB_LT:
                            case KB_LE:
                                if (thisv > bestv)
                                    goto replace;
                                else if (thisv < bestv)
                                    goto nomatch;
                            break;
                            case KB_NEAR:
                                if (thisv >= argv[j].a_w.w_float &&
                                    bestv >= argv[j].a_w.w_float)
                                {
                                    if (thisv < bestv)
                                        goto replace;
                                    else if (thisv > bestv)
                                        goto nomatch;
                                }
                                else if (thisv <= argv[j].a_w.w_float &&
                                    bestv <= argv[j].a_w.w_float)
                                {
                                    if (thisv > bestv)
                                        goto replace;
                                    else if (thisv < bestv)
                                        goto nomatch;
                                }
                                else
                                {
                                    float d1 = thisv - argv[j].a_w.w_float,
                                        d2 = bestv - argv[j].a_w.w_float;
                                    if (d1 < 0)
                                        d1 = -d1;
                                    if (d2 < 0)
                                        d2 = -d2;

                                    if (d1 < d2)
                                        goto replace;
                                    else if (d1 > d2)
                                        goto nomatch;
                                }
                            break;
                                /* the other possibility ('=') never decides */
                        }
                    }
                    if (++j >= nkeys)    /* last key - increment field */
                        field++;
                    else field = x->x_keyvec[j].k_field,    /* else next key */
                            binop = x->x_keyvec[j].k_binop;
                }
                goto nomatch;   /* a tie - keep the old one */
            replace:
                bestline = lineno, beststart = thisstart, bestn = thisn;
            }
                /* no previous match so we're best */
            else bestline = lineno, beststart = thisstart, bestn = thisn;
        nomatch:
            lineno++;
            thisstart = i+1;
        }
    }
    outlet_float(x->x_out1, bestline);
}